

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,texcoord3f *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *p_Var2;
  string local_78;
  string local_58;
  string local_38;
  texcoord3f *local_18;
  texcoord3f *v_local;
  ostream *os_local;
  
  this = "(";
  local_18 = v;
  v_local = (texcoord3f *)os;
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)this,local_18->s);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  p_Var2 = (_anonymous_namespace_ *)0x3a9baf;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,p_Var2,local_18->t);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  p_Var2 = (_anonymous_namespace_ *)0x3a9baf;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_78,p_Var2,local_18->r);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const tinyusdz::value::texcoord3f &v) {
  os << "(" << tinyusdz::dtos(v.s) << ", " << tinyusdz::dtos(v.t) << ", "
     << tinyusdz::dtos(v.r) << ")";
  return os;
}